

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<signed_char>::growTo(vec<signed_char> *this,uint size,char *pad)

{
  char cVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = (ulong)this->sz;
    if (this->sz < size) {
      cVar1 = *pad;
      do {
        this->data[uVar2] = cVar1;
        uVar2 = uVar2 + 1;
      } while (size != uVar2);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}